

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-knowledge.c
# Opt level: O3

void equip_learn_on_ranged_attack(player *p)

{
  _Bool _Var1;
  wchar_t wVar2;
  object *obj;
  size_t sVar3;
  player_shape *ppVar4;
  int *piVar5;
  long lVar6;
  size_t sVar7;
  wchar_t slot;
  
  if (p->obj_k->to_h == 0) {
    if ((p->body).count != 0) {
      slot = L'\0';
      do {
        obj = slot_object(p,slot);
        wVar2 = slot_by_name(p,"weapon");
        if ((slot != wVar2) &&
           (wVar2 = slot_by_name(p,"shooting"), obj != (object *)0x0 && slot != wVar2)) {
          if (obj->known == (object *)0x0) {
            __assert_fail("obj->known",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/obj-knowledge.c"
                          ,0x7be,"void equip_learn_on_ranged_attack(struct player *)");
          }
          _Var1 = object_has_standard_to_h(obj);
          if (!_Var1) {
            sVar7 = 0xffffffffffffffff;
            if (rune_max != 0) {
              piVar5 = &rune_list->index;
              lVar6 = 0;
              sVar3 = rune_max;
              do {
                if ((((rune *)(piVar5 + -1))->variety == RUNE_VAR_COMBAT) && (*piVar5 == 1)) {
                  sVar7 = lVar6 >> 0x20;
                  break;
                }
                lVar6 = lVar6 + 0x100000000;
                piVar5 = piVar5 + 6;
                sVar3 = sVar3 - 1;
              } while (sVar3 != 0);
            }
            player_learn_rune(p,sVar7,true);
          }
          object_curses_find_to_h(p,obj);
          if (p->obj_k->to_h != 0) {
            return;
          }
        }
        slot = slot + L'\x01';
      } while ((uint)slot < (uint)(p->body).count);
    }
    if ((p->shape != (player_shape *)0x0) &&
       (ppVar4 = lookup_player_shape(p->shape->name), ppVar4->to_h != L'\0')) {
      sVar7 = 0xffffffffffffffff;
      if (rune_max != 0) {
        piVar5 = &rune_list->index;
        lVar6 = 0;
        sVar3 = rune_max;
        do {
          if ((((rune *)(piVar5 + -1))->variety == RUNE_VAR_COMBAT) && (*piVar5 == 1)) {
            sVar7 = lVar6 >> 0x20;
            break;
          }
          lVar6 = lVar6 + 0x100000000;
          piVar5 = piVar5 + 6;
          sVar3 = sVar3 - 1;
        } while (sVar3 != 0);
      }
      player_learn_rune(p,sVar7,true);
      return;
    }
  }
  return;
}

Assistant:

void equip_learn_on_ranged_attack(struct player *p)
{
	int i;

	if (p->obj_k->to_h) return;

	for (i = 0; i < p->body.count; i++) {
		struct object *obj = slot_object(p, i);
		if (i == slot_by_name(p, "weapon")) continue;
		if (i == slot_by_name(p, "shooting")) continue;
		if (obj) {
			assert(obj->known);
			if (!object_has_standard_to_h(obj)) {
				int index = rune_index(RUNE_VAR_COMBAT, COMBAT_RUNE_TO_H);
				player_learn_rune(p, index, true);
			}
			object_curses_find_to_h(p, obj);
			if (p->obj_k->to_h) return;
		}
	}
	if (p->shape) {
		struct player_shape *shape = lookup_player_shape(p->shape->name);
		if (shape->to_h != 0) {
			int index = rune_index(RUNE_VAR_COMBAT, COMBAT_RUNE_TO_H);
			player_learn_rune(p, index, true);
		}
	}
}